

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O1

int genaNotifyAllCommon(UpnpDevice_Handle device_handle,char *UDN,char *servId,char *propertySet)

{
  void *input;
  bool bVar1;
  Upnp_Handle_Type UVar2;
  uint uVar3;
  int *__ptr;
  char *__ptr_00;
  char *__ptr_01;
  char *__ptr_02;
  service_info *service;
  undefined8 *__ptr_03;
  time_t tVar4;
  long lVar5;
  ListNode *pLVar6;
  subscription *psVar7;
  LinkedList *list;
  int line;
  Handle_Info **HndInfo;
  subscription *psVar8;
  int DbgLineNo;
  Handle_Info *handle_info;
  subscription *local_70;
  Handle_Info *local_38;
  
  __ptr_00 = (char *)0x0;
  line = 2;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x337,"GENA BEGIN NOTIFY ALL COMMON\n");
  __ptr = (int *)malloc(4);
  if (__ptr == (int *)0x0) {
    DbgLineNo = 0x33d;
LAB_0012164c:
    __ptr_01 = (char *)0x0;
  }
  else {
    *__ptr = 0;
    __ptr_00 = strdup(UDN);
    if (__ptr_00 == (char *)0x0) {
      DbgLineNo = 0x345;
      __ptr_00 = (char *)0x0;
      goto LAB_0012164c;
    }
    __ptr_01 = strdup(servId);
    if (__ptr_01 == (char *)0x0) {
      DbgLineNo = 0x34c;
      goto LAB_0012164c;
    }
    __ptr_02 = AllocGenaHeaders(propertySet);
    if (__ptr_02 != (char *)0x0) {
      HandleLock((char *)0x358,line);
      HndInfo = &local_38;
      UVar2 = GetHandleInfo(device_handle,HndInfo);
      line = (int)HndInfo;
      if (UVar2 == HND_DEVICE) {
        service = FindServiceId(&local_38->ServiceTable,servId,UDN);
        line = (int)servId;
        if (service == (service_info *)0x0) {
          uVar3 = 0xffffff91;
          DbgLineNo = 0x3a3;
        }
        else {
          local_70 = GetFirstSubscription(service);
          DbgLineNo = 0;
          uVar3 = 0;
          do {
            line = (int)servId;
            if (local_70 == (subscription *)0x0) break;
            __ptr_03 = (undefined8 *)malloc(0x68);
            if (__ptr_03 == (undefined8 *)0x0) {
              DbgLineNo = 0x369;
LAB_00121598:
              bVar1 = false;
              uVar3 = 0xffffff98;
              psVar8 = (subscription *)servId;
            }
            else {
              *__ptr = *__ptr + 1;
              __ptr_03[0xb] = __ptr;
              __ptr_03[3] = __ptr_00;
              __ptr_03[2] = __ptr_01;
              *__ptr_03 = __ptr_02;
              __ptr_03[1] = propertySet;
              psVar8 = local_70;
              strncpy((char *)(__ptr_03 + 4),local_70->sid,0x2c);
              *(undefined1 *)((long)__ptr_03 + 0x4b) = 0;
              tVar4 = time((time_t *)0x0);
              __ptr_03[10] = tVar4;
              *(UpnpDevice_Handle *)(__ptr_03 + 0xc) = device_handle;
              list = &local_70->outgoing;
              tVar4 = time((time_t *)0x0);
              lVar5 = ListSize(list);
              while (1 < lVar5) {
                pLVar6 = ListHead(list);
                if ((pLVar6 == (ListNode *)0x0) ||
                   (psVar7 = (subscription *)pLVar6->next, psVar7 == (subscription *)0x0)) {
                  genaNotifyAllCommon_cold_1();
                  break;
                }
                input = *(void **)((long)*(void **)((long)psVar7->sid + 0x10) + 8);
                lVar5 = ListSize(list);
                if ((lVar5 <= g_UpnpSdkEQMaxLen) &&
                   (tVar4 - *(long *)((long)input + 0x50) <= (long)g_UpnpSdkEQMaxAge)) break;
                free_notify_struct(input);
                free(*(void **)((long)psVar7->sid + 0x10));
                ListDelNode(list,(ListNode *)psVar7,0);
                lVar5 = ListSize(list);
                psVar8 = psVar7;
              }
              servId = (char *)malloc(0x30);
              if ((subscription *)servId == (subscription *)0x0) {
                free(__ptr_03);
                DbgLineNo = 0x380;
                bVar1 = false;
                uVar3 = 0xffffff98;
              }
              else {
                *(__suseconds_t *)((long)((subscription *)servId)->sid + 0x20) = 0;
                *(undefined8 *)((long)((subscription *)servId)->sid + 0x28) = 0;
                *(free_routine *)((long)((subscription *)servId)->sid + 0x10) = (free_routine)0x0;
                ((timeval *)((long)((subscription *)servId)->sid + 0x18))->tv_sec = 0;
                *(start_routine *)((subscription *)servId)->sid = (start_routine)0x0;
                *(void **)((long)((subscription *)servId)->sid + 8) = (void *)0x0;
                TPJobInit((ThreadPoolJob *)servId,genaNotifyThread,__ptr_03);
                TPJobSetFreeFunction((ThreadPoolJob *)servId,free_notify_struct);
                TPJobSetPriority((ThreadPoolJob *)servId,MED_PRIORITY);
                pLVar6 = ListAddTail(list,servId);
                lVar5 = ListSize(list);
                if (lVar5 == 1) {
                  uVar3 = ThreadPoolAdd(&gSendThreadPool,(ThreadPoolJob *)servId,(int *)0x0);
                  if (uVar3 != 0) {
                    if (uVar3 == 0x20000000) {
                      DbgLineNo = 0x396;
                      goto LAB_00121598;
                    }
                    DbgLineNo = 0x394;
                    bVar1 = false;
                    psVar8 = (subscription *)servId;
                    goto LAB_00121610;
                  }
                  uVar3 = 0;
                  if (pLVar6 != (ListNode *)0x0) {
                    *(undefined4 *)((long)pLVar6->item + 0x2c) = 0x1fffffff;
                  }
                }
                psVar7 = GetNextSubscription(service,local_70);
                bVar1 = true;
                psVar8 = local_70;
                local_70 = psVar7;
              }
            }
LAB_00121610:
            line = (int)psVar8;
            servId = psVar8->sid;
          } while (bVar1);
        }
      }
      else {
        uVar3 = 0xffffff9c;
        DbgLineNo = 0x35b;
      }
      goto LAB_00121655;
    }
    DbgLineNo = 0x353;
  }
  __ptr_02 = (char *)0x0;
  uVar3 = 0xffffff98;
LAB_00121655:
  if ((__ptr != (int *)0x0) && (*__ptr == 0)) {
    free(__ptr_02);
    ixmlFreeDOMString(propertySet);
    free(__ptr_01);
    free(__ptr_00);
    free(__ptr);
  }
  HandleUnlock((char *)0x3b5,line);
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",DbgLineNo,
             "GENA END NOTIFY ALL COMMON, ret = %d\n",(ulong)uVar3);
  return uVar3;
}

Assistant:

static int genaNotifyAllCommon(UpnpDevice_Handle device_handle,
	char *UDN,
	char *servId,
	DOMString propertySet)
{
	int ret = GENA_SUCCESS;
	int line = 0;

	int *reference_count = NULL;
	char *UDN_copy = NULL;
	char *servId_copy = NULL;
	char *headers = NULL;
	notify_thread_struct *thread_s = NULL;

	subscription *finger = NULL;
	service_info *service = NULL;
	struct Handle_Info *handle_info;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENA BEGIN NOTIFY ALL COMMON\n");

	/* Keep this allocation first */
	reference_count = (int *)malloc(sizeof(int));
	if (reference_count == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}
	*reference_count = 0;

	UDN_copy = strdup(UDN);
	if (UDN_copy == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	servId_copy = strdup(servId);
	if (servId_copy == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	headers = AllocGenaHeaders(propertySet);
	if (headers == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	HandleLock(__FILE__, __LINE__);

	if (GetHandleInfo(device_handle, &handle_info) != HND_DEVICE) {
		line = __LINE__;
		ret = GENA_E_BAD_HANDLE;
	} else {
		service =
			FindServiceId(&handle_info->ServiceTable, servId, UDN);
		if (service != NULL) {
			finger = GetFirstSubscription(service);
			while (finger) {
				ThreadPoolJob *job = NULL;
				ListNode *node;

				thread_s = (notify_thread_struct *)malloc(
					sizeof(notify_thread_struct));
				if (thread_s == NULL) {
					line = __LINE__;
					ret = UPNP_E_OUTOF_MEMORY;
					break;
				}

				(*reference_count)++;
				thread_s->reference_count = reference_count;
				thread_s->UDN = UDN_copy;
				thread_s->servId = servId_copy;
				thread_s->headers = headers;
				thread_s->propertySet = propertySet;
				strncpy(thread_s->sid,
					finger->sid,
					sizeof thread_s->sid);
				thread_s->sid[sizeof thread_s->sid - 1] = 0;
				thread_s->ctime = time(0);
				thread_s->device_handle = device_handle;

				maybeDiscardEvents(&finger->outgoing);
				job = (ThreadPoolJob *)malloc(
					sizeof(ThreadPoolJob));
				if (!job) {
					free(thread_s);
					line = __LINE__;
					ret = UPNP_E_OUTOF_MEMORY;
					break;
				}
				memset(job, 0, sizeof(ThreadPoolJob));
				TPJobInit(job,
					(start_routine)genaNotifyThread,
					thread_s);
				TPJobSetFreeFunction(
					job, (free_routine)free_notify_struct);
				TPJobSetPriority(job, MED_PRIORITY);
				node = ListAddTail(&finger->outgoing, job);

				/* If there is only one element on the list
				   (which we just
				   added), need to kickstart the threadpool */
				if (ListSize(&finger->outgoing) == 1) {
					ret = ThreadPoolAdd(
						&gSendThreadPool, job, NULL);
					if (ret != 0) {
						line = __LINE__;
						if (ret == EOUTOFMEM) {
							line = __LINE__;
							ret = UPNP_E_OUTOF_MEMORY;
						}
						break;
					}
					if (node) {
						((ThreadPoolJob *)(node->item))
							->jobId = STALE_JOBID;
					}
				}
				finger = GetNextSubscription(service, finger);
			}
		} else {
			line = __LINE__;
			ret = GENA_E_BAD_SERVICE;
		}
	}

ExitFunction:
	/* The only case where we want to free memory here is if the
	   struct was never queued. Else, let the normal cleanup take place.
	   reference_count is allocated first so it's ok to do nothing if it's 0
	*/
	if (reference_count && *reference_count == 0) {
		free(headers);
		ixmlFreeDOMString(propertySet);
		free(servId_copy);
		free(UDN_copy);
		free(reference_count);
	}

	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		line,
		"GENA END NOTIFY ALL COMMON, ret = %d\n",
		ret);

	return ret;
}